

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

QModelIndex * __thiscall
QTreeView::moveCursor
          (QModelIndex *__return_storage_ptr__,QTreeView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  QTreeViewPrivate *this_00;
  QHeaderView *this_01;
  QTreeViewItem *pQVar1;
  ulong uVar2;
  QAbstractItemModel *pQVar3;
  uint uVar4;
  undefined4 uVar5;
  quintptr qVar6;
  bool bVar7;
  uint uVar8;
  LayoutDirection LVar9;
  int iVar10;
  CursorAction CVar11;
  uint i_00;
  int iVar12;
  QStyle *pQVar13;
  QScrollBar *this_02;
  QWidget *this_03;
  long lVar14;
  int i;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  QModelIndex local_70;
  undefined8 local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_58,(QAbstractItemView *)this);
  if ((((int)local_58 < 0) || ((long)local_58 < 0)) || (local_48.ptr == (QAbstractItemModel *)0x0))
  {
    lVar14 = -1;
    iVar10 = 0;
    do {
      bVar7 = QTreeViewPrivate::isItemHiddenOrDisabled(this_00,iVar10);
      lVar14 = lVar14 + 1;
      iVar10 = iVar10 + 1;
    } while (bVar7);
    i_00 = 0xffffffff;
    if (lVar14 < (this_00->viewItems).d.size) {
      i_00 = (uint)lVar14;
    }
    iVar10 = QHeaderView::count(this_00->header);
    iVar16 = 0;
    if (0 < iVar10) {
      do {
        this_01 = this_00->header;
        iVar10 = QHeaderView::logicalIndex(this_01,iVar16);
        bVar7 = QHeaderView::isSectionHidden(this_01,iVar10);
        if (!bVar7) break;
        iVar16 = iVar16 + 1;
        iVar10 = QHeaderView::count(this_00->header);
      } while (iVar16 < iVar10);
    }
    if (((this_00->viewItems).d.size <= (long)(int)i_00) ||
       (iVar10 = QHeaderView::count(this_00->header), iVar10 <= iVar16)) {
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      goto LAB_005b12c8;
    }
    iVar10 = QHeaderView::logicalIndex(this_00->header,iVar16);
    goto LAB_005b12c3;
  }
  uVar8 = QTreeViewPrivate::viewIndex(this_00,(QModelIndex *)&local_58);
  i_00 = 0;
  if (0 < (int)uVar8) {
    i_00 = uVar8;
  }
  LVar9 = QWidget::layoutDirection((QWidget *)this);
  CVar11 = cursorAction;
  if (((LVar9 == RightToLeft) && (CVar11 = MoveLeft, cursorAction != MoveRight)) &&
     (CVar11 = MoveRight, cursorAction != MoveLeft)) {
    CVar11 = cursorAction;
  }
  switch(CVar11) {
  case MoveUp:
  case MovePrevious:
    uVar8 = i_00;
    do {
      uVar4 = uVar8;
      uVar8 = uVar4 - 1;
      bVar7 = QTreeViewPrivate::isItemHiddenOrDisabled(this_00,uVar8);
    } while (bVar7);
    if (0 < (int)uVar4) {
      i_00 = uVar8;
    }
    goto LAB_005b114e;
  case MoveDown:
  case MoveNext:
    uVar17 = (ulong)i_00;
    do {
      uVar17 = uVar17 + 1;
      bVar7 = QTreeViewPrivate::isItemHiddenOrDisabled(this_00,(uint)uVar17);
    } while (bVar7);
    if (uVar17 < (ulong)(this_00->viewItems).d.size) {
      i_00 = (uint)uVar17;
    }
LAB_005b114e:
    iVar10 = local_58._4_4_;
    break;
  case MoveLeft:
    this_02 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    if ((((ulong)i_00 < (ulong)(this_00->viewItems).d.size) &&
        (((this_00->viewItems).d.ptr[i_00].field_0x1c & 1) != 0)) &&
       (this_00->itemsExpandable == true)) {
      iVar10 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
      iVar16 = QAbstractSlider::minimum(&this_02->super_QAbstractSlider);
      if (iVar10 == iVar16) {
        QTreeViewPrivate::collapse(this_00,i_00,true);
        goto LAB_005b1700;
      }
    }
    pQVar13 = QWidget::style((QWidget *)this);
    iVar10 = (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,0x4f,0,this,0);
    if (iVar10 != 0) {
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->r = -0x55555556;
      __return_storage_ptr__->c = -0x55555556;
      *(undefined4 *)&__return_storage_ptr__->i = 0xaaaaaaaa;
      *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = 0xaaaaaaaa;
      if (local_48.ptr == (QAbstractItemModel *)0x0) {
        __return_storage_ptr__->r = -1;
        __return_storage_ptr__->c = -1;
        __return_storage_ptr__->i = 0;
        (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      }
      else {
        (**(code **)(*(long *)local_48.ptr + 0x68))(__return_storage_ptr__,local_48.ptr,&local_58);
      }
      if (((-1 < __return_storage_ptr__->r) && (-1 < __return_storage_ptr__->c)) &&
         ((__return_storage_ptr__->m).ptr != (QAbstractItemModel *)0x0)) {
        QAbstractItemView::rootIndex(&local_70,(QAbstractItemView *)this);
        if (((__return_storage_ptr__->r != local_70.r) || (__return_storage_ptr__->c != local_70.c))
           || (((undefined1 *)__return_storage_ptr__->i != (undefined1 *)local_70.i ||
               ((__return_storage_ptr__->m).ptr != local_70.m.ptr)))) goto LAB_005b12c8;
      }
    }
    if (((this_00->super_QAbstractItemViewPrivate).selectionBehavior & ~SelectColumns) ==
        SelectItems) {
      iVar10 = QHeaderView::visualIndex(this_00->header,local_58._4_4_);
      do {
        iVar16 = iVar10 + -1;
        if (iVar10 < 1) break;
        iVar10 = QHeaderView::logicalIndex(this_00->header,iVar16);
        bVar7 = QHeaderView::isSectionHidden
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x590),iVar10);
        iVar10 = iVar16;
      } while (bVar7);
      iVar10 = QHeaderView::logicalIndex(this_00->header,iVar16);
      __return_storage_ptr__->r = -0x55555556;
      __return_storage_ptr__->c = -0x55555556;
      *(undefined4 *)&__return_storage_ptr__->i = 0xaaaaaaaa;
      *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = 0xaaaaaaaa;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      if (local_48.ptr == (QAbstractItemModel *)0x0) {
        __return_storage_ptr__->r = -1;
        __return_storage_ptr__->c = -1;
        __return_storage_ptr__->i = 0;
        (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      }
      else if (local_58._4_4_ == iVar10) {
        (__return_storage_ptr__->m).ptr = local_48.ptr;
        *(undefined1 **)__return_storage_ptr__ = local_58;
        __return_storage_ptr__->i = (quintptr)puStack_50;
      }
      else {
        (**(code **)(*(long *)local_48.ptr + 0x70))
                  (__return_storage_ptr__,local_48.ptr,(ulong)local_58 & 0xffffffff,iVar10);
      }
      if (((-1 < __return_storage_ptr__->r) && (-1 < __return_storage_ptr__->c)) &&
         ((__return_storage_ptr__->m).ptr != (QAbstractItemModel *)0x0)) goto LAB_005b12c8;
    }
    iVar10 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
    iVar16 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
    iVar12 = QAbstractSlider::singleStep(&this_02->super_QAbstractSlider);
    iVar16 = iVar16 - iVar12;
LAB_005b16e9:
    QAbstractSlider::setValue(&this_02->super_QAbstractSlider,iVar16);
    iVar16 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
    if (iVar10 != iVar16) goto LAB_005b1700;
    goto LAB_005b1708;
  case MoveRight:
    uVar17 = (ulong)i_00;
    if (((((ulong)(this_00->viewItems).d.size <= uVar17) ||
         (pQVar1 = (this_00->viewItems).d.ptr, (pQVar1[uVar17].field_0x1c & 1) != 0)) ||
        (this_00->itemsExpandable != true)) ||
       (bVar7 = QTreeViewPrivate::hasVisibleChildren(this_00,&pQVar1[uVar17].index), !bVar7)) {
      pQVar13 = QWidget::style((QWidget *)this);
      iVar10 = (**(code **)(*(long *)pQVar13 + 0xf0))(pQVar13,0x4f,0,this,0);
      if (iVar10 != 0) {
        (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
        __return_storage_ptr__->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        do {
          uVar17 = uVar17 + 1;
          bVar7 = QTreeViewPrivate::isItemHiddenOrDisabled(this_00,(int)uVar17);
        } while (bVar7);
        uVar2 = (this_00->viewItems).d.size;
        uVar15 = (ulong)i_00;
        if (uVar17 < uVar2) {
          uVar15 = uVar17 & 0xffffffff;
        }
        if (uVar15 < uVar2) {
          (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
          __return_storage_ptr__->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          pQVar1 = (this_00->viewItems).d.ptr;
          (__return_storage_ptr__->m).ptr = pQVar1[uVar15].index.m.ptr;
          pQVar1 = pQVar1 + uVar15;
          iVar10 = (pQVar1->index).c;
          qVar6 = (pQVar1->index).i;
          uVar5 = *(undefined4 *)((long)&(pQVar1->index).i + 4);
          __return_storage_ptr__->r = (pQVar1->index).r;
          __return_storage_ptr__->c = iVar10;
          *(int *)&__return_storage_ptr__->i = (int)qVar6;
          *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = uVar5;
        }
        else {
          __return_storage_ptr__->r = -1;
          __return_storage_ptr__->c = -1;
          __return_storage_ptr__->i = 0;
          (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
        }
        pQVar3 = (__return_storage_ptr__->m).ptr;
        if (pQVar3 == (QAbstractItemModel *)0x0) {
          local_70.r = -1;
          local_70.c = -1;
          local_70.i = 0;
          local_70.m.ptr = (QAbstractItemModel *)0x0;
        }
        else {
          (**(code **)(*(long *)pQVar3 + 0x68))(&local_70,pQVar3,__return_storage_ptr__);
        }
        if (local_70.r == (int)local_58) {
          if (((local_70.c == local_58._4_4_) && ((undefined1 *)local_70.i == puStack_50)) &&
             (local_70.m.ptr == local_48.ptr)) goto LAB_005b12c8;
        }
      }
      if (((this_00->super_QAbstractItemViewPrivate).selectionBehavior & ~SelectColumns) ==
          SelectItems) {
        iVar10 = QHeaderView::visualIndex(this_00->header,local_58._4_4_);
        do {
          iVar10 = iVar10 + 1;
          pQVar3 = (this_00->super_QAbstractItemViewPrivate).model;
          if (local_48.ptr == (QAbstractItemModel *)0x0) {
            local_70.r = -1;
            local_70.c = -1;
            local_70.i = 0;
            local_70.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (**(code **)(*(long *)local_48.ptr + 0x68))(&local_70,local_48.ptr,&local_58);
          }
          iVar16 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_70);
          if (iVar16 <= iVar10) break;
          iVar16 = QHeaderView::logicalIndex(this_00->header,iVar10);
          bVar7 = QHeaderView::isSectionHidden
                            (*(QHeaderView **)
                              (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                         super_QFrame.super_QWidget.field_0x8 + 0x590),iVar16);
        } while (bVar7);
        iVar10 = QHeaderView::logicalIndex(this_00->header,iVar10);
        *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
        __return_storage_ptr__->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        QModelIndex::sibling(__return_storage_ptr__,(QModelIndex *)&local_58,(int)local_58,iVar10);
        if (((-1 < __return_storage_ptr__->r) && (-1 < __return_storage_ptr__->c)) &&
           ((__return_storage_ptr__->m).ptr != (QAbstractItemModel *)0x0)) goto LAB_005b12c8;
      }
      this_02 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar10 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
      iVar16 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
      iVar12 = QAbstractSlider::singleStep(&this_02->super_QAbstractSlider);
      iVar16 = iVar16 + iVar12;
      goto LAB_005b16e9;
    }
    QTreeViewPrivate::expand(this_00,i_00,true);
LAB_005b1700:
    (this_00->super_QAbstractItemViewPrivate).moveCursorUpdatedView = true;
LAB_005b1708:
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x268))(this);
    this_03 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QWidget::update(this_03);
switchD_005b110a_default:
    (__return_storage_ptr__->m).ptr = local_48.ptr;
    *(undefined1 **)__return_storage_ptr__ = local_58;
    __return_storage_ptr__->i = (quintptr)puStack_50;
    goto LAB_005b12c8;
  case MoveHome:
    uVar17 = 0xffffffffffffffff;
    iVar10 = 0;
    do {
      bVar7 = QTreeViewPrivate::isItemHiddenOrDisabled(this_00,iVar10);
      uVar17 = uVar17 + 1;
      iVar10 = iVar10 + 1;
    } while (bVar7);
    i_00 = (uint)uVar17;
    if ((ulong)(this_00->viewItems).d.size <= uVar17) {
      i_00 = 0;
    }
    iVar10 = local_58._4_4_;
    break;
  case MoveEnd:
    i_00 = (uint)(this_00->viewItems).d.size;
    do {
      i_00 = i_00 - 1;
      bVar7 = QTreeViewPrivate::isItemHiddenOrDisabled(this_00,i_00);
    } while (bVar7);
    if (i_00 == 0xffffffff) {
      i_00 = (int)(this_00->viewItems).d.size - 1;
    }
    iVar10 = local_58._4_4_;
    break;
  case MovePageUp:
    i_00 = QTreeViewPrivate::pageUp(this_00,i_00);
    goto LAB_005b12b7;
  case MovePageDown:
    i_00 = QTreeViewPrivate::pageDown(this_00,i_00);
LAB_005b12b7:
    iVar10 = local_58._4_4_;
    break;
  default:
    goto switchD_005b110a_default;
  }
LAB_005b12c3:
  QTreeViewPrivate::modelIndex(__return_storage_ptr__,this_00,i_00,iVar10);
LAB_005b12c8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QTreeView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QTreeView);
    Q_UNUSED(modifiers);

    d->executePostedLayout();

    QModelIndex current = currentIndex();
    if (!current.isValid()) {
        int i = d->below(-1);
        int c = 0;
        while (c < d->header->count() && d->header->isSectionHidden(d->header->logicalIndex(c)))
            ++c;
        if (i < d->viewItems.size() && c < d->header->count()) {
            return d->modelIndex(i, d->header->logicalIndex(c));
        }
        return QModelIndex();
    }

    const int vi = qMax(0, d->viewIndex(current));

    if (isRightToLeft()) {
        if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
        else if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
    }
    switch (cursorAction) {
    case MoveNext:
    case MoveDown:
#ifdef QT_KEYPAD_NAVIGATION
        if (vi == d->viewItems.count()-1 && QApplicationPrivate::keypadNavigationEnabled())
            return d->model->index(0, current.column(), d->root);
#endif
        return d->modelIndex(d->below(vi), current.column());
    case MovePrevious:
    case MoveUp:
#ifdef QT_KEYPAD_NAVIGATION
        if (vi == 0 && QApplicationPrivate::keypadNavigationEnabled())
            return d->modelIndex(d->viewItems.count() - 1, current.column());
#endif
        return d->modelIndex(d->above(vi), current.column());
    case MoveLeft: {
        QScrollBar *sb = horizontalScrollBar();
        if (vi < d->viewItems.size() && d->viewItems.at(vi).expanded && d->itemsExpandable && sb->value() == sb->minimum()) {
            d->collapse(vi, true);
            d->moveCursorUpdatedView = true;
        } else {
            bool descend = style()->styleHint(QStyle::SH_ItemView_ArrowKeysNavigateIntoChildren, nullptr, this);
            if (descend) {
                QModelIndex par = current.parent();
                if (par.isValid() && par != rootIndex())
                    return par;
                else
                    descend = false;
            }
            if (!descend) {
                if (d->selectionBehavior == SelectItems || d->selectionBehavior == SelectColumns) {
                    int visualColumn = d->header->visualIndex(current.column()) - 1;
                    while (visualColumn >= 0 && isColumnHidden(d->header->logicalIndex(visualColumn)))
                        visualColumn--;
                    int newColumn = d->header->logicalIndex(visualColumn);
                    QModelIndex next = current.sibling(current.row(), newColumn);
                    if (next.isValid())
                        return next;
                }

                int oldValue = sb->value();
                sb->setValue(sb->value() - sb->singleStep());
                if (oldValue != sb->value())
                    d->moveCursorUpdatedView = true;
            }

        }
        updateGeometries();
        viewport()->update();
        break;
    }
    case MoveRight:
        if (vi < d->viewItems.size() && !d->viewItems.at(vi).expanded && d->itemsExpandable
            && d->hasVisibleChildren(d->viewItems.at(vi).index)) {
            d->expand(vi, true);
            d->moveCursorUpdatedView = true;
        } else {
            bool descend = style()->styleHint(QStyle::SH_ItemView_ArrowKeysNavigateIntoChildren, nullptr, this);
            if (descend) {
                QModelIndex idx = d->modelIndex(d->below(vi));
                if (idx.parent() == current)
                    return idx;
                else
                    descend = false;
            }
            if (!descend) {
                if (d->selectionBehavior == SelectItems || d->selectionBehavior == SelectColumns) {
                    int visualColumn = d->header->visualIndex(current.column()) + 1;
                    while (visualColumn < d->model->columnCount(current.parent()) && isColumnHidden(d->header->logicalIndex(visualColumn)))
                        visualColumn++;
                    const int newColumn = d->header->logicalIndex(visualColumn);
                    const QModelIndex next = current.sibling(current.row(), newColumn);
                    if (next.isValid())
                        return next;
                }

                //last restort: we change the scrollbar value
                QScrollBar *sb = horizontalScrollBar();
                int oldValue = sb->value();
                sb->setValue(sb->value() + sb->singleStep());
                if (oldValue != sb->value())
                    d->moveCursorUpdatedView = true;
            }
        }
        updateGeometries();
        viewport()->update();
        break;
    case MovePageUp:
        return d->modelIndex(d->pageUp(vi), current.column());
    case MovePageDown:
        return d->modelIndex(d->pageDown(vi), current.column());
    case MoveHome:
        return d->modelIndex(d->itemForKeyHome(), current.column());
    case MoveEnd:
        return d->modelIndex(d->itemForKeyEnd(), current.column());
    }
    return current;
}